

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

MultisamplePixelBufferAccess * __thiscall
sglr::ReferenceContext::getDrawDepthbuffer
          (MultisamplePixelBufferAccess *__return_storage_ptr__,ReferenceContext *this)

{
  PixelBufferAccess PStack_38;
  
  if (this->m_drawFramebufferBinding == (Framebuffer *)0x0) {
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)__return_storage_ptr__,
               (ConstPixelBufferAccess *)&this->m_defaultDepthbuffer);
  }
  else {
    getFboAttachment(&PStack_38,this,this->m_drawFramebufferBinding,ATTACHMENTPOINT_DEPTH);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(__return_storage_ptr__,&PStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

rr::MultisamplePixelBufferAccess	getDrawDepthbuffer		(void)	{ return (m_drawFramebufferBinding) ? (rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(getFboAttachment(*m_drawFramebufferBinding, rc::Framebuffer::ATTACHMENTPOINT_DEPTH)))	:	(m_defaultDepthbuffer);		}